

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

XmlWriter * __thiscall
doctest::anon_unknown_14::XmlWriter::startElement(XmlWriter *this,string *name)

{
  ostream *poVar1;
  XmlWriter *in_RSI;
  XmlWriter *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  XmlWriter *__x;
  
  __x = in_RDI;
  ensureTagClosed(in_RSI);
  newlineIfNecessary(in_RSI);
  poVar1 = std::operator<<(in_RDI->m_os,(string *)&in_RDI->m_indent);
  poVar1 = std::operator<<(poVar1,'<');
  std::operator<<(poVar1,(string *)in_RSI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(unaff_retaddr,(value_type *)__x);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
             &in_RDI->m_tagIsOpen);
  in_RDI->m_tagIsOpen = true;
  return in_RDI;
}

Assistant:

XmlWriter& XmlWriter::startElement( std::string const& name ) {
        ensureTagClosed();
        newlineIfNecessary();
        m_os << m_indent << '<' << name;
        m_tags.push_back( name );
        m_indent += "  ";
        m_tagIsOpen = true;
        return *this;
    }